

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O3

Stream * rw::readSkin(Stream *stream,int32 len,void *object,int32 offset,int32 param_5)

{
  int32 numVertices;
  Stream *pSVar1;
  Skin *this;
  float *pfVar2;
  int32 iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint8 header [4];
  byte local_3c;
  char local_3b;
  byte local_3a;
  void *local_38;
  
  if (*(int **)((long)object + 0x98) == (int *)0x0) {
    (*stream->_vptr_Stream[4])(stream,&local_3c,4);
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/skin.cpp line: 137"
    ;
    this = (Skin *)(*DAT_00149de8)(0x70,0x30116);
    *(Skin **)((long)object + (long)offset) = this;
    if (local_3b == '\0') {
      Skin::init(this,(EVP_PKEY_CTX *)(ulong)local_3c);
      this->numWeights = (uint)local_3a;
    }
    else {
      Skin::init(this,(EVP_PKEY_CTX *)(ulong)local_3c);
      this->numWeights = (uint)local_3a;
      (*stream->_vptr_Stream[4])(stream,this->usedBones,(ulong)(uint)this->numUsedBones);
    }
    if (this->indices != (uint8 *)0x0) {
      (*stream->_vptr_Stream[4])
                (stream,this->indices,(ulong)(uint)(*(int *)((long)object + 0x1c) << 2));
    }
    if (this->weights != (float *)0x0) {
      Stream::read32(stream,this->weights,*(int *)((long)object + 0x1c) << 4);
    }
    local_38 = object;
    if (0 < this->numBones) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        if (local_3b == '\0') {
          (*stream->_vptr_Stream[5])(stream,4,1);
        }
        Stream::read32(stream,(void *)((long)this->inverseMatrices + lVar5),0x40);
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x40;
      } while (lVar6 < this->numBones);
    }
    if (local_3b == '\0') {
      numVertices = *(int32 *)((long)local_38 + 0x1c);
      this->numWeights = 1;
      if (numVertices != 0) {
        pfVar2 = this->weights;
        lVar5 = 1;
        iVar3 = numVertices;
        do {
          iVar3 = iVar3 + -1;
          iVar4 = (int)lVar5;
          lVar5 = (long)iVar4;
          iVar4 = iVar4 + 1;
          while ((pfVar2[lVar5] != 0.0 || (NAN(pfVar2[lVar5])))) {
            lVar5 = lVar5 + 1;
            this->numWeights = iVar4;
            iVar4 = iVar4 + 1;
            if (iVar4 == 5) goto LAB_00130ace;
          }
          pfVar2 = pfVar2 + 4;
        } while (iVar3 != 0);
      }
LAB_00130ace:
      Skin::findUsedBones(this,numVertices);
    }
    else {
      readSkinSplitData(stream,this);
    }
  }
  else {
    iVar4 = **(int **)((long)object + 0x98);
    if (iVar4 == 0xb) {
      pSVar1 = wdgl::readNativeSkin(stream,len,object,offset);
      return pSVar1;
    }
    if (iVar4 == 5) {
      pSVar1 = xbox::readNativeSkin(stream,len,object,offset);
      return pSVar1;
    }
    if (iVar4 == 4) {
      pSVar1 = ps2::readNativeSkin(stream,len,object,offset);
      return pSVar1;
    }
    stream = (Stream *)0x0;
  }
  return stream;
}

Assistant:

static Stream*
readSkin(Stream *stream, int32 len, void *object, int32 offset, int32)
{
	uint8 header[4];
	Geometry *geometry = (Geometry*)object;

	if(geometry->instData){
		// TODO: function pointers
		if(geometry->instData->platform == PLATFORM_PS2)
			return ps2::readNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_WDGL)
			return wdgl::readNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_XBOX)
			return xbox::readNativeSkin(stream, len, object, offset);
		else{
			assert(0 && "unsupported native skin platform");
			return nil;
		}
	}

	stream->read8(header, 4);  // numBones, numUsedBones,
	                          // numWeights, unused
	Skin *skin = rwNewT(Skin, 1, MEMDUR_EVENT | ID_SKIN);
	*PLUGINOFFSET(Skin*, geometry, offset) = skin;

	// numUsedBones and numWeights appear in/after 34003
	// but not in/before 33002 (probably rw::version >= 0x34000)
	bool oldFormat = header[1] == 0;

	// Use numBones for numUsedBones to allocate data,
	// find out the correct value later
	if(oldFormat)
		skin->init(header[0], header[0], geometry->numVertices);
	else
		skin->init(header[0], header[1], geometry->numVertices);
	skin->numWeights = header[2];

	if(!oldFormat)
		stream->read8(skin->usedBones, skin->numUsedBones);
	if(skin->indices)
		stream->read8(skin->indices, geometry->numVertices*4);
	if(skin->weights)
		stream->read32(skin->weights, geometry->numVertices*16);
	for(int32 i = 0; i < skin->numBones; i++){
		if(oldFormat)
			stream->seek(4);	// skip 0xdeaddead
		stream->read32(&skin->inverseMatrices[i*16], 64);
	}

	if(oldFormat){
		skin->findNumWeights(geometry->numVertices);
		skin->findUsedBones(geometry->numVertices);
	}

	if(!oldFormat)
		readSkinSplitData(stream, skin);

	return stream;
}